

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::(anonymous_namespace)::AsyncPipe::write(AsyncPipe *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  anon_unknown_123::AsyncPipe::write((AsyncPipe *)this,in_ESI + -8,in_RDX,in_RCX);
  return;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (buffer == nullptr) {
      return READY_NOW;
    } else KJ_IF_SOME(s, state) {
      return s.write(buffer);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(*this, buffer, nullptr);
    }
  }